

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void aes_schedule(cf_aes_context *ctx,uint8_t *key,size_t nkey)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t *puVar8;
  
  uVar3 = nkey >> 2;
  uVar1 = ctx->rounds;
  puVar8 = ctx->ks;
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    uVar2 = read32_be(key);
    puVar8[uVar6] = uVar2;
    key = key + 4;
  }
  uVar6 = 1;
  uVar5 = 0;
  for (uVar7 = uVar3; iVar4 = (int)uVar5, uVar7 < (ulong)(uVar1 + 1) << 2; uVar7 = uVar7 + 1) {
    uVar2 = puVar8[uVar3 - 1];
    if (uVar3 == uVar5) {
      iVar4 = 0;
    }
    uVar6 = (ulong)((int)uVar6 + (uint)(uVar3 == uVar5));
    if (iVar4 == 0) {
      uVar2 = sub_word(uVar2 << 8 | uVar2 >> 0x18,S);
      uVar2 = (uint)Rcon[uVar6] << 0x18 ^ uVar2;
    }
    else if ((0x1b < nkey) && (iVar4 == 4)) {
      uVar2 = sub_word(uVar2,S);
    }
    puVar8[uVar3] = uVar2 ^ *puVar8;
    uVar5 = (ulong)(iVar4 + 1);
    puVar8 = puVar8 + 1;
  }
  return;
}

Assistant:

static void aes_schedule(cf_aes_context *ctx, const uint8_t *key, size_t nkey)
{
  size_t i,
         nb = AES_BLOCKSZ / 4,
         nk = nkey / 4,
         n = nb * (ctx->rounds + 1);
  uint32_t *w = ctx->ks;

  /* First words are just the key. */
  for (i = 0; i < nk; i++)
  {
    w[i] = read32_be(key + i * 4);
  }

  uint32_t i_div_nk = 1;
  uint32_t i_mod_nk = 0;

  for (; i < n; i++, i_mod_nk++)
  {
    uint32_t temp = w[i - 1];
    
    if (i_mod_nk == nk)
    {
      i_div_nk++;
      i_mod_nk = 0;
    }

    if (i_mod_nk == 0)
      temp = sub_word(rot_word(temp), S) ^ round_constant(i_div_nk);
    else if (nk > 6 && i_mod_nk == 4)
      temp = sub_word(temp, S);

    w[i] = w[i - nk] ^ temp;
  }
}